

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O2

void __thiscall
DivideTest<int>::test_all_algorithms(DivideTest<int> *this,int denom,set_t<int> *tested_denom)

{
  iterator iVar1;
  int local_1c;
  
  local_1c = denom;
  iVar1 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                    (&tested_denom->_M_t,&local_1c);
  if (&(tested_denom->_M_t)._M_impl.super__Rb_tree_header == (_Rb_tree_header *)iVar1._M_node) {
    test_many<(libdivide::Branching)0>(this,local_1c);
    test_many<(libdivide::Branching)1>(this,local_1c);
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               tested_denom,&local_1c);
  }
  return;
}

Assistant:

void test_all_algorithms(T denom, set_t<T> &tested_denom) {
#if !defined(__AVR__)
        if (tested_denom.end() == tested_denom.find(denom)) {
#endif
            PRINT_PROGRESS_MSG(F("Testing deom "));
            PRINT_PROGRESS_MSG(denom);
            PRINT_PROGRESS_MSG(F("\n"));
            test_many<BRANCHFULL>(denom);
            test_many<BRANCHFREE>(denom);
#if !defined(__AVR__)
            tested_denom.insert(denom);
        }
#else
        UNUSED(tested_denom);
#endif
    }